

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayoutTests.cpp
# Opt level: O2

void __thiscall
agge::tests::LayoutTests::NextWordIsDisplayedWithoutSpacesOnWordBreakWhenNextWordIsFound
          (LayoutTests *this)

{
  wrap limiter;
  __normal_iterator<const_agge::text_line_*,_std::vector<agge::text_line,_std::allocator<agge::text_line>_>_>
  end;
  long lVar1;
  allocator local_499;
  factory_ptr f;
  __shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2> local_488;
  __shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2> local_478;
  __shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2> local_468;
  int local_454 [17];
  _Vector_base<agge::text_line,_std::allocator<agge::text_line>_> local_410;
  _Vector_base<int,_std::allocator<int>_> local_3f8;
  _Vector_base<int,_std::allocator<int>_> local_3e0;
  vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> local_3c8;
  _Vector_base<int,_std::allocator<int>_> local_3b0;
  _Vector_base<int,_std::allocator<int>_> local_398;
  _Vector_base<int,_std::allocator<int>_> local_380;
  _Vector_base<int,_std::allocator<int>_> local_368;
  vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> local_350;
  _Vector_base<int,_std::allocator<int>_> local_338;
  _Vector_base<int,_std::allocator<int>_> local_320;
  _Vector_base<int,_std::allocator<int>_> local_308;
  _Vector_base<int,_std::allocator<int>_> local_2f0;
  _Vector_base<int,_std::allocator<int>_> local_2d8;
  vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> local_2c0;
  vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> local_2a8;
  vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> local_290;
  vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> local_278;
  ref_glyph_run local_260;
  string local_228;
  LocationInfo local_208;
  ref_text_line local_1e0;
  ref_text_line local_1b8;
  ref_text_line local_190;
  ref_glyph_run local_168;
  richtext_t local_130;
  layout l;
  char_to_index indices [2];
  _Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_> local_68;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  end._M_current = (text_line *)indices;
  indices[0].symbol = 0x41;
  indices[0].index = 0;
  indices[1].symbol = 0x20;
  indices[1].index = 1;
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x4014000000000000;
  local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_50 = 0;
  uStack_48 = 0;
  local_40 = 0x4010000000000000;
  local_38 = 0;
  uStack_30 = 0;
  local_28 = 0;
  uStack_20 = 0;
  create_single_font_factory<2ul,2ul>
            ((LayoutTests *)&f,(font_metrics *)this,
             (char_to_index (*) [2])(anonymous_namespace)::c_fm1,(glyph (*) [2])end._M_current);
  layout::layout(&l);
  std::__cxx11::string::string((string *)&local_260,"AAAAA   AAAA    AA",(allocator *)&local_168);
  R(&local_130,(string *)&local_260);
  local_454[0xb] = 0x421c0000;
  local_454[0xc] = 0;
  local_454[0xd] = 0;
  local_454[0xe] = 0;
  local_454[0xf] = 0;
  local_454[0x10] = local_454[0x10] & 0xffffff00;
  lVar1 = (ulong)(uint)local_454[0x10] << 0x20;
  limiter._sow.next = (int)lVar1;
  limiter._previous_space = (bool)(char)((ulong)lVar1 >> 0x20);
  limiter._21_3_ = (int3)((ulong)lVar1 >> 0x28);
  limiter._limit = 39.0;
  limiter._eow.extent = 0.0;
  limiter._eow.next = 0;
  limiter._sow.extent = 0.0;
  layout::process<agge::limit::wrap,agge::tests::LayoutTests::font_factory>
            (&l,&local_130,limiter,
             f.
             super___shared_ptr<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr);
  annotated_string<char,_agge::font_style_annotation>::~annotated_string(&local_130);
  std::__cxx11::string::~string((string *)&local_260);
  std::__shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_468,
             &((f.
                super___shared_ptr<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr)->font_).super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>);
  local_454[10] = 0;
  plural_::operator+((vector<int,_std::allocator<int>_> *)&local_338,(plural_ *)&plural,
                     local_454 + 10);
  local_454[9] = 0;
  tests::operator+((vector<int,_std::allocator<int>_> *)&local_320,
                   (vector<int,_std::allocator<int>_> *)&local_338,local_454 + 9);
  local_454[8] = 0;
  tests::operator+((vector<int,_std::allocator<int>_> *)&local_308,
                   (vector<int,_std::allocator<int>_> *)&local_320,local_454 + 8);
  local_454[7] = 0;
  tests::operator+((vector<int,_std::allocator<int>_> *)&local_2f0,
                   (vector<int,_std::allocator<int>_> *)&local_308,local_454 + 7);
  local_454[6] = 0;
  tests::operator+((vector<int,_std::allocator<int>_> *)&local_2d8,
                   (vector<int,_std::allocator<int>_> *)&local_2f0,local_454 + 6);
  ref_glyph_run::ref_glyph_run<int>
            ((ref_glyph_run *)&local_130,(shared_ptr<agge::font> *)&local_468,0.0,0.0,
             (vector<int,_std::allocator<int>_> *)&local_2d8);
  plural_::operator+(&local_2c0,(plural_ *)&plural,(ref_glyph_run *)&local_130);
  ref_text_line::ref_text_line(&local_190,0.0,10.0,0.0,&local_2c0);
  plural_::operator+(&local_2a8,(plural_ *)&plural,&local_190);
  std::__shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_478,
             &((f.
                super___shared_ptr<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr)->font_).super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>);
  local_454[5] = 0;
  plural_::operator+((vector<int,_std::allocator<int>_> *)&local_3b0,(plural_ *)&plural,
                     local_454 + 5);
  local_454[4] = 0;
  tests::operator+((vector<int,_std::allocator<int>_> *)&local_398,
                   (vector<int,_std::allocator<int>_> *)&local_3b0,local_454 + 4);
  local_454[3] = 0;
  tests::operator+((vector<int,_std::allocator<int>_> *)&local_380,
                   (vector<int,_std::allocator<int>_> *)&local_398,local_454 + 3);
  local_454[2] = 0;
  tests::operator+((vector<int,_std::allocator<int>_> *)&local_368,
                   (vector<int,_std::allocator<int>_> *)&local_380,local_454 + 2);
  ref_glyph_run::ref_glyph_run<int>
            (&local_260,(shared_ptr<agge::font> *)&local_478,0.0,0.0,
             (vector<int,_std::allocator<int>_> *)&local_368);
  plural_::operator+(&local_350,(plural_ *)&plural,&local_260);
  ref_text_line::ref_text_line(&local_1b8,0.0,24.0,0.0,&local_350);
  tests::operator+(&local_290,&local_2a8,&local_1b8);
  std::__shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_488,
             &((f.
                super___shared_ptr<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr)->font_).super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>);
  local_454[1] = 0;
  plural_::operator+((vector<int,_std::allocator<int>_> *)&local_3f8,(plural_ *)&plural,
                     local_454 + 1);
  local_454[0] = 0;
  tests::operator+((vector<int,_std::allocator<int>_> *)&local_3e0,
                   (vector<int,_std::allocator<int>_> *)&local_3f8,local_454);
  ref_glyph_run::ref_glyph_run<int>
            (&local_168,(shared_ptr<agge::font> *)&local_488,0.0,0.0,
             (vector<int,_std::allocator<int>_> *)&local_3e0);
  plural_::operator+(&local_3c8,(plural_ *)&plural,&local_168);
  ref_text_line::ref_text_line(&local_1e0,0.0,38.0,0.0,&local_3c8);
  tests::operator+(&local_278,&local_290,&local_1e0);
  mkvector<__gnu_cxx::__normal_iterator<agge::text_line_const*,std::vector<agge::text_line,std::allocator<agge::text_line>>>>
            ((vector<agge::text_line,_std::allocator<agge::text_line>_> *)&local_410,
             (tests *)l._text_lines.
                      super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>._M_impl.
                      super__Vector_impl_data._M_start,
             (__normal_iterator<const_agge::text_line_*,_std::vector<agge::text_line,_std::allocator<agge::text_line>_>_>
              )l._text_lines.super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>.
               _M_impl.super__Vector_impl_data._M_finish,end);
  std::__cxx11::string::string
            ((string *)&local_228,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/LayoutTests.cpp"
             ,&local_499);
  ut::LocationInfo::LocationInfo(&local_208,&local_228,0x200);
  ut::
  are_equal<std::vector<agge::tests::ref_text_line,std::allocator<agge::tests::ref_text_line>>,std::vector<agge::text_line,std::allocator<agge::text_line>>>
            (&local_278,(vector<agge::text_line,_std::allocator<agge::text_line>_> *)&local_410,
             &local_208);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)&local_228);
  std::_Vector_base<agge::text_line,_std::allocator<agge::text_line>_>::~_Vector_base(&local_410);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::~vector
            (&local_278);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_1e0._glyph_runs);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_3c8);
  ref_glyph_run::~ref_glyph_run(&local_168);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_3e0);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_3f8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_488._M_refcount);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::~vector
            (&local_290);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_1b8._glyph_runs);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_350);
  ref_glyph_run::~ref_glyph_run(&local_260);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_368);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_380);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_398);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_3b0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_478._M_refcount);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::~vector
            (&local_2a8);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_190._glyph_runs);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_2c0);
  ref_glyph_run::~ref_glyph_run((ref_glyph_run *)&local_130);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_2d8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_2f0);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_308);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_320);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_338);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_468._M_refcount);
  layout::~layout(&l);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&f.
              super___shared_ptr<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  lVar1 = 0x38;
  do {
    std::_Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>::
    ~_Vector_base((_Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_> *
                  )((long)&local_68._M_impl.super__Vector_impl_data._M_start + lVar1));
    lVar1 = lVar1 + -0x28;
  } while (lVar1 != -0x18);
  return;
}

Assistant:

test( NextWordIsDisplayedWithoutSpacesOnWordBreakWhenNextWordIsFound )
			{
				// INIT
				mocks::font_accessor::char_to_index indices[] = { { L'A', 0 }, { L' ', 1 }, };
				mocks::font_accessor::glyph glyphs[] = {
					{ { 5, 0 } },
					{ { 4, 0 } },
				};
				factory_ptr f = create_single_font_factory(c_fm1, indices, glyphs);
				layout l;

				// ACT
				l.process(R("AAAAA   AAAA    AA"), limit::wrap(39.0f), *f);

				// ASSERT
				assert_equal(plural
					+ ref_text_line(0.0f, 10.0f, 0.0f, plural + ref_glyph_run(**f, 0.0f, 0.0f, plural + 0 + 0 + 0 + 0 + 0))
					+ ref_text_line(0.0f, 24.0f, 0.0f, plural + ref_glyph_run(**f, 0.0f, 0.0f, plural + 0 + 0 + 0 + 0))
					+ ref_text_line(0.0f, 38.0f, 0.0f, plural + ref_glyph_run(**f, 0.0f, 0.0f, plural + 0 + 0)),
					mkvector(l.begin(), l.end()));
			}